

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parentedentity.cpp
# Opt level: O2

void __thiscall
libcellml::ParentedEntity::ParentedEntityImpl::removeParent(ParentedEntityImpl *this)

{
  __weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mParent).
              super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>,&local_18);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_18._M_refcount);
  return;
}

Assistant:

void ParentedEntity::ParentedEntityImpl::removeParent()
{
    mParent = {};
}